

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O2

MQTTErrors mqtt_disconnect(mqtt_client *client)

{
  mqtt_pal_mutex_t *__mutex;
  size_t nbytes;
  mqtt_queued_message *pmVar1;
  MQTTErrors MVar2;
  
  __mutex = &client->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (client->error < 0) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return client->error;
  }
  nbytes = mqtt_pack_disconnect((client->mq).curr,(client->mq).curr_sz);
  if ((long)nbytes < 0) {
LAB_00103012:
    MVar2 = (MQTTErrors)nbytes;
    client->error = MVar2;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  else {
    if (nbytes == 0) {
      mqtt_mq_clean(&client->mq);
      nbytes = mqtt_pack_disconnect((client->mq).curr,(client->mq).curr_sz);
      if ((long)nbytes < 0) goto LAB_00103012;
      if (nbytes == 0) {
        client->error = MQTT_ERROR_SEND_BUFFER_IS_FULL;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        return MQTT_ERROR_SEND_BUFFER_IS_FULL;
      }
    }
    pmVar1 = mqtt_mq_register(&client->mq,nbytes);
    pmVar1->control_type = MQTT_CONTROL_DISCONNECT;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    MVar2 = MQTT_OK;
  }
  return MVar2;
}

Assistant:

enum MQTTErrors mqtt_disconnect(struct mqtt_client *client) 
{
    ssize_t rv;
    struct mqtt_queued_message *msg;
    MQTT_PAL_MUTEX_LOCK(&client->mutex);

    /* try to pack the message */
    MQTT_CLIENT_TRY_PACK(
        rv, msg, client, 
        mqtt_pack_disconnect(
            client->mq.curr, client->mq.curr_sz
        ), 
        1
    );
    /* save the control type and packet id of the message */
    msg->control_type = MQTT_CONTROL_DISCONNECT;

    MQTT_PAL_MUTEX_UNLOCK(&client->mutex);
    return MQTT_OK;
}